

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg_tools.cxx
# Opt level: O0

int write_prelim_header(OggVorbis_File *vf,FILE *out,int64_t knownlength)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  vorbis_info *pvVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  int samplesize;
  int align;
  int bytespersec;
  int samplerate;
  int channels;
  uint size;
  int64_t knownlength_local;
  FILE *out_local;
  OggVorbis_File *vf_local;
  
  samplerate = 0x7fffffff;
  pvVar5 = ov_info(vf,0);
  iVar1 = pvVar5->channels;
  pvVar5 = ov_info(vf,0);
  lVar2 = pvVar5->rate;
  iVar3 = (iVar1 * (int)lVar2 * bits) / 8;
  iVar4 = (iVar1 * bits) / 8;
  if ((knownlength != 0) && (((knownlength * bits) / 8) * (long)iVar1 < 0x7fffffff)) {
    samplerate = (int)((knownlength * bits) / 8) * iVar1 + 0x2c;
  }
  builtin_memcpy(headbuf,"RIFF",4);
  headbuf[4] = (char)samplerate + 0xf8;
  headbuf[5] = (uchar)((uint)(samplerate + -8) >> 8);
  headbuf[6] = (uchar)((uint)(samplerate + -8) >> 0x10);
  headbuf[7] = (uchar)((uint)(samplerate + -8) >> 0x18);
  builtin_memcpy(headbuf + 8,"WAVEfmt \x10",10);
  headbuf[0x12] = '\0';
  headbuf[0x13] = '\0';
  headbuf[0x14] = '\x01';
  headbuf[0x15] = '\0';
  headbuf[0x16] = (uchar)iVar1;
  headbuf[0x17] = (uchar)((uint)iVar1 >> 8);
  headbuf[0x18] = (uchar)lVar2;
  headbuf[0x19] = (uchar)((ulong)lVar2 >> 8);
  headbuf[0x1a] = (uchar)((ulong)lVar2 >> 0x10);
  headbuf[0x1b] = (uchar)((ulong)lVar2 >> 0x18);
  headbuf[0x1c] = (uchar)iVar3;
  headbuf[0x1d] = (uchar)((uint)iVar3 >> 8);
  headbuf[0x1e] = (uchar)((uint)iVar3 >> 0x10);
  headbuf[0x1f] = (uchar)((uint)iVar3 >> 0x18);
  headbuf[0x20] = (uchar)iVar4;
  headbuf[0x21] = (uchar)((uint)iVar4 >> 8);
  headbuf[0x22] = (uchar)bits;
  headbuf[0x23] = (uchar)((uint)bits >> 8);
  builtin_memcpy(headbuf + 0x24,"data",4);
  headbuf[0x28] = (char)samplerate + 0xd4;
  headbuf[0x29] = (uchar)((uint)(samplerate + -0x2c) >> 8);
  headbuf[0x2a] = (uchar)((uint)(samplerate + -0x2c) >> 0x10);
  headbuf[0x2b] = (uchar)((uint)(samplerate + -0x2c) >> 0x18);
  sVar6 = fwrite(headbuf,1,0x2c,(FILE *)out);
  if (sVar6 != 0x2c) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    xray_re::msg("ERROR: Failed to write Wave header: %s",pcVar8);
  }
  vf_local._4_4_ = (uint)(sVar6 != 0x2c);
  return vf_local._4_4_;
}

Assistant:

int write_prelim_header(OggVorbis_File *vf, FILE *out, int64_t knownlength) {
	unsigned int size = 0x7fffffff;
	int channels = ov_info(vf,0)->channels;
	int samplerate = ov_info(vf,0)->rate;
	int bytespersec = channels*samplerate*bits/8;
	int align = channels*bits/8;
	int samplesize = bits;

	if(knownlength && knownlength*bits/8*channels < size)
		size = (unsigned int)(knownlength*bits/8*channels+44) ;

	memcpy(headbuf, "RIFF", 4);
	WRITE_U32(headbuf+4, size-8);
	memcpy(headbuf+8, "WAVE", 4);
	memcpy(headbuf+12, "fmt ", 4);
	WRITE_U32(headbuf+16, 16);
	WRITE_U16(headbuf+20, 1); /* format */
	WRITE_U16(headbuf+22, channels);
	WRITE_U32(headbuf+24, samplerate);
	WRITE_U32(headbuf+28, bytespersec);
	WRITE_U16(headbuf+32, align);
	WRITE_U16(headbuf+34, samplesize);
	memcpy(headbuf+36, "data", 4);
	WRITE_U32(headbuf+40, size - 44);

	if(fwrite(headbuf, 1, 44, out) != 44) {
		msg("ERROR: Failed to write Wave header: %s", strerror(errno));
		return 1;
	}

	return 0;
}